

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

bool __thiscall
Parser::try_parse_message<ParsedGame::LevelsTokenType>
          (Parser *this,
          vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
          *tokens_array)

{
  undefined8 uVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  pointer pTVar5;
  byte local_182;
  byte local_15a;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  reverse_iterator it;
  string local_128;
  Token<ParsedGame::LevelsTokenType> local_108;
  allocator<char> local_d1;
  string local_d0;
  Token<ParsedGame::LevelsTokenType> local_b0;
  allocator<char> local_79;
  string local_78;
  ci_equal local_56;
  byte local_55;
  ci_equal equal_comp;
  bool detected_word_end;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string temp_buffer;
  vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
  *tokens_array_local;
  Parser *this_local;
  
  temp_buffer.field_2._8_8_ = tokens_array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                     (&this->m_text_provider);
  TextProvider::get_current_char(pTVar5);
  std::__cxx11::string::push_back((char)local_40);
  local_55 = 0;
  while( true ) {
    pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    uVar4 = (*pTVar5->_vptr_TextProvider[2])();
    local_15a = 0;
    if ((uVar4 & 1) != 0) {
      local_15a = local_55 ^ 0xff;
    }
    if ((local_15a & 1) == 0) break;
    pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    (*pTVar5->_vptr_TextProvider[3])();
    bVar3 = try_parse_return(this,false);
    if (bVar3) {
      local_55 = 1;
    }
    else {
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      cVar2 = TextProvider::get_current_char(pTVar5);
      if (cVar2 == ' ') {
        local_55 = 1;
      }
      else {
        pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        TextProvider::get_current_char(pTVar5);
        std::__cxx11::string::push_back((char)local_40);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Message",&local_79);
  bVar3 = ci_equal::operator()(&local_56,&local_78,(string *)local_40);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  uVar1 = temp_buffer.field_2._8_8_;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    Token<ParsedGame::LevelsTokenType>::Token(&local_b0,MESSAGE,&local_d0,this->m_line_counter);
    std::
    vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
    ::push_back((vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
                 *)uVar1,&local_b0);
    Token<ParsedGame::LevelsTokenType>::~Token(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::clear();
    local_55 = 0;
    while( true ) {
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      uVar4 = (*pTVar5->_vptr_TextProvider[2])();
      uVar1 = temp_buffer.field_2._8_8_;
      local_182 = 0;
      if ((uVar4 & 1) != 0) {
        local_182 = local_55 ^ 0xff;
      }
      if ((local_182 & 1) == 0) break;
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      (*pTVar5->_vptr_TextProvider[3])();
      bVar3 = try_parse_return(this,false);
      if (bVar3) {
        local_55 = 1;
        pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        (*pTVar5->_vptr_TextProvider[4])();
      }
      else {
        pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        TextProvider::get_current_char(pTVar5);
        std::__cxx11::string::push_back((char)local_40);
      }
    }
    std::__cxx11::string::string((string *)&local_128,(string *)local_40);
    Token<ParsedGame::LevelsTokenType>::Token
              (&local_108,MessageContent,&local_128,this->m_line_counter);
    std::
    vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
    ::push_back((vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
                 *)uVar1,&local_108);
    Token<ParsedGame::LevelsTokenType>::~Token(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::rbegin();
    while( true ) {
      std::__cxx11::string::rend();
      bVar3 = std::operator!=(&local_138,&local_140);
      if (!bVar3) break;
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      (*pTVar5->_vptr_TextProvider[4])();
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_148,(int)&local_138);
    }
    this_local._7_1_ = false;
  }
  it.current._M_current._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool try_parse_message(vector<Token<TokenType>>& tokens_array)
	{
		string temp_buffer = "";
		temp_buffer.push_back(m_text_provider->get_current_char());

		bool detected_word_end = false;
		while(m_text_provider->is_valid() && !detected_word_end)
		{
			m_text_provider->advance();
			if(try_parse_return(false))
			{
				detected_word_end = true;
			}
			else
			{
				switch(m_text_provider->get_current_char())
				{
					case ' ':
						detected_word_end = true;
					break;
					default:
						temp_buffer.push_back(m_text_provider->get_current_char());
					break;
				}
			}
		}

		ci_equal equal_comp;
		if(equal_comp("Message",temp_buffer))
		{
			//add token message and parse the rest
			tokens_array.push_back(Token<TokenType>(TokenType::MESSAGE,"",m_line_counter));

			temp_buffer.clear();

			detected_word_end = false;
			while(m_text_provider->is_valid() && !detected_word_end)
			{
				m_text_provider->advance();
				if(try_parse_return(false))
				{
					detected_word_end = true;
					m_text_provider->reverse();
				}
				else
				{
					temp_buffer.push_back(m_text_provider->get_current_char());
				}
			}
			tokens_array.push_back(Token<TokenType>(TokenType::MessageContent,temp_buffer,m_line_counter));

			return true;
		}
		else
		{
			//reverse everything and return false, we couldn't properly parse a message token
			for(auto it = temp_buffer.rbegin(); it != temp_buffer.rend(); it++)
			{
				m_text_provider->reverse();
			}
			return false;
		}
	}